

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void pstack::print_container<std::vector<int,std::allocator<int>>,char_const&>
               (ostream *os,undefined8 *container)

{
  int *piVar1;
  size_t sVar2;
  char *__s;
  int *field;
  int *piVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  piVar3 = (int *)*container;
  piVar1 = (int *)container[1];
  if (piVar3 != piVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      std::ostream::operator<<((ostream *)os,*piVar3);
      piVar3 = piVar3 + 1;
      __s = ",\n";
    } while (piVar3 != piVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}